

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::reactive_socket_send_op_base
          (reactive_socket_send_op_base<asio::const_buffers_1> *this,error_code *success_ec,
          socket_type socket,state_type state,const_buffers_1 *buffers,message_flags flags,
          func_type complete_func)

{
  message_flags flags_local;
  const_buffers_1 *buffers_local;
  state_type state_local;
  socket_type socket_local;
  error_code *success_ec_local;
  reactive_socket_send_op_base<asio::const_buffers_1> *this_local;
  
  reactor_op::reactor_op(&this->super_reactor_op,success_ec,do_perform,complete_func);
  this->socket_ = socket;
  this->state_ = state;
  (this->buffers_).super_const_buffer.data_ = (buffers->super_const_buffer).data_;
  (this->buffers_).super_const_buffer.size_ = (buffers->super_const_buffer).size_;
  this->flags_ = flags;
  return;
}

Assistant:

reactive_socket_send_op_base(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const ConstBufferSequence& buffers,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(success_ec,
        &reactive_socket_send_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      buffers_(buffers),
      flags_(flags)
  {
  }